

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O3

size_type fs_with_suffix(char *path,char *new_suffix,char *result,size_type buffer_size)

{
  string_view new_suffix_00;
  string_view path_00;
  size_type sVar1;
  string_view s;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  
  strlen(path);
  strlen(new_suffix);
  path_00._M_str = in_stack_ffffffffffffffc0;
  path_00._M_len = in_stack_ffffffffffffffb8;
  new_suffix_00._M_str = in_stack_ffffffffffffffb0;
  new_suffix_00._M_len = in_stack_ffffffffffffffa8;
  fs_with_suffix_abi_cxx11_(path_00,new_suffix_00);
  s._M_str = in_stack_ffffffffffffffb0;
  s._M_len = in_stack_ffffffffffffffb8;
  sVar1 = fs_str2char(s,result,buffer_size);
  if (in_stack_ffffffffffffffb0 != &stack0xffffffffffffffc0) {
    operator_delete(in_stack_ffffffffffffffb0,(ulong)(in_stack_ffffffffffffffc0 + 1));
  }
  return sVar1;
}

Assistant:

std::string::size_type fs_with_suffix(const char* path, const char* new_suffix,
                         char* result, const std::string::size_type buffer_size){
  return fs_str2char(fs_with_suffix(path, new_suffix), result, buffer_size);
}